

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdAddTapBranchByScriptTreeString(void *handle,void *tree_handle,char *tree_string)

{
  Script *pSVar1;
  TapBranch *this;
  TaprootScriptTree *this_00;
  bool bVar2;
  CfdException *this_01;
  TapBranch add_branch;
  allocator local_121;
  TapBranch local_120;
  TapBranch local_a8;
  
  cfd::Initialize();
  pSVar1 = &local_120.script_;
  local_120._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_120);
  if ((Script *)local_120._vptr_TapBranch != pSVar1) {
    operator_delete(local_120._vptr_TapBranch);
  }
  bVar2 = cfd::capi::IsEmptyString(tree_string);
  if (!bVar2) {
    std::__cxx11::string::string((string *)&local_a8,tree_string,&local_121);
    cfd::core::TapBranch::FromString(&local_120,(string *)&local_a8);
    if ((Script *)local_a8._vptr_TapBranch != &local_a8.script_) {
      operator_delete(local_a8._vptr_TapBranch);
    }
    this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
    if (this == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
      this_00 = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
      if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this_00) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      cfd::core::TaprootScriptTree::AddBranch(this_00,&local_120);
    }
    else {
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_a8,this);
      if ((Script *)local_a8._vptr_TapBranch != &local_a8.script_) {
        operator_delete(local_a8._vptr_TapBranch);
      }
      if (local_a8._8_8_ == 0) {
        cfd::core::TapBranch::TapBranch(&local_a8,&local_120);
        cfd::core::TapBranch::operator=(this,&local_a8);
        cfd::core::TapBranch::~TapBranch(&local_a8);
      }
      else {
        cfd::core::TapBranch::AddBranch(this,&local_120);
      }
    }
    cfd::core::TapBranch::~TapBranch(&local_120);
    return 0;
  }
  local_120._vptr_TapBranch = (_func_int **)0x5f3330;
  local_120.has_leaf_ = true;
  local_120.leaf_version_ = '\x02';
  local_120._10_2_ = 0;
  local_120.script_._vptr_Script = (_func_int **)0x5f37d1;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_120,kCfdLogLevelWarning,"tree_string is null or empty.");
  this_01 = (CfdException *)__cxa_allocate_exception(0x30);
  local_120._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"Failed to parameter. tree_string is null or empty.","");
  cfd::core::CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&local_120);
  __cxa_throw(this_01,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTapBranchByScriptTreeString(
    void* handle, void* tree_handle, const char* tree_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(tree_string)) {
      warn(CFD_LOG_SOURCE, "tree_string is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tree_string is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);

    TapBranch add_branch = TapBranch::FromString(tree_string);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(add_branch);  // override
      } else {
        branch.AddBranch(add_branch);
      }
    } else {
      auto& dest_tree = buffer->tree_buffer->at(0);
      dest_tree.AddBranch(add_branch);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}